

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::find_static_extensions(CompilerGLSL *this)

{
  ExecutionModel EVar1;
  Capability CVar2;
  bool bVar3;
  CompilerError *pCVar4;
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [38];
  undefined1 local_3e2;
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  Capability *local_370;
  Capability *cap;
  Capability *__end1;
  Capability *__begin1;
  SmallVector<spv::Capability,_8UL> *__range1;
  string local_348 [39];
  allocator local_321;
  string local_320 [38];
  undefined1 local_2fa;
  allocator local_2f9;
  string local_2f8 [38];
  undefined1 local_2d2;
  allocator local_2d1;
  string local_2d0 [38];
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [38];
  undefined1 local_232;
  allocator local_231;
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [38];
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [38];
  undefined1 local_16a;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  SPIREntryPoint *local_20;
  SPIREntryPoint *execution;
  CompilerGLSL *local_10;
  CompilerGLSL *this_local;
  
  execution = (SPIREntryPoint *)this;
  local_10 = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerGLSL::find_static_extensions()::__0>
            (&(this->super_Compiler).ir,(anon_class_8_1_8991fb9c *)&execution);
  local_20 = Compiler::get_entry_point(&this->super_Compiler);
  EVar1 = local_20->model;
  if (EVar1 - ExecutionModelTessellationControl < 2) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_118,"GL_EXT_tessellation_shader",&local_119);
      require_extension_internal(this,(string *)local_118);
      ::std::__cxx11::string::~string(local_118);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_119);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 400)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_140,"GL_ARB_tessellation_shader",&local_141);
      require_extension_internal(this,(string *)local_140);
      ::std::__cxx11::string::~string(local_140);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_141);
    }
  }
  else if (EVar1 == ExecutionModelGeometry) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a0,"GL_EXT_geometry_shader",&local_a1);
      require_extension_internal(this,(string *)local_a0);
      ::std::__cxx11::string::~string(local_a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x96)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c8,"GL_ARB_geometry_shader4",&local_c9);
      require_extension_internal(this,(string *)local_c8);
      ::std::__cxx11::string::~string(local_c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    bVar3 = Bitset::get(&local_20->flags,0);
    if ((((bVar3) && (local_20->invocations != 1)) && (((this->options).es & 1U) == 0)) &&
       ((this->options).version < 400)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f0,"GL_ARB_gpu_shader5",&local_f1);
      require_extension_internal(this,(string *)local_f0);
      ::std::__cxx11::string::~string(local_f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
  }
  else if (EVar1 == ExecutionModelGLCompute) {
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1ae)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"GL_ARB_compute_shader",&local_41);
      require_extension_internal(this,(string *)local_40);
      ::std::__cxx11::string::~string(local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x136)) {
      local_7a = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_78,"At least ESSL 3.10 required for compute shaders.",&local_79);
      CompilerError::CompilerError(pCVar4,(string *)local_78);
      local_7a = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
  }
  else if (EVar1 - ExecutionModelRayGenerationKHR < 6) {
    if ((((this->options).es & 1U) != 0) || ((this->options).version < 0x1cc)) {
      local_16a = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_168,"Ray tracing shaders require non-es profile with version 460 or above.",
                 &local_169);
      CompilerError::CompilerError(pCVar4,(string *)local_168);
      local_16a = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_190,"GL_NV_ray_tracing",&local_191);
    require_extension_internal(this,(string *)local_190);
    ::std::__cxx11::string::~string(local_190);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  bVar3 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                    (&this->pls_inputs);
  if ((!bVar3) ||
     (bVar3 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                        (&this->pls_outputs), !bVar3)) {
    if (local_20->model != ExecutionModelFragment) {
      local_1ba = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1b8,"Can only use GL_EXT_shader_pixel_local_storage in fragment shaders.",
                 &local_1b9);
      CompilerError::CompilerError(pCVar4,(string *)local_1b8);
      local_1ba = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1e0,"GL_EXT_shader_pixel_local_storage",&local_1e1);
    require_extension_internal(this,(string *)local_1e0);
    ::std::__cxx11::string::~string(local_1e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  bVar3 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::empty(&this->inout_color_attachments);
  if (!bVar3) {
    if (local_20->model != ExecutionModelFragment) {
      local_20a = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_208,"Can only use GL_EXT_shader_framebuffer_fetch in fragment shaders.",
                 &local_209);
      CompilerError::CompilerError(pCVar4,(string *)local_208);
      local_20a = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).vulkan_semantics & 1U) != 0) {
      local_232 = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_230,"Cannot use EXT_shader_framebuffer_fetch in Vulkan GLSL.",&local_231);
      CompilerError::CompilerError(pCVar4,(string *)local_230);
      local_232 = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_258,"GL_EXT_shader_framebuffer_fetch",&local_259);
    require_extension_internal(this,(string *)local_258);
    ::std::__cxx11::string::~string(local_258);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_259);
  }
  if (((((this->options).separate_shader_objects & 1U) != 0) && (((this->options).es & 1U) == 0)) &&
     ((this->options).version < 0x19a)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_280,"GL_ARB_separate_shader_objects",&local_281);
    require_extension_internal(this,(string *)local_280);
    ::std::__cxx11::string::~string(local_280);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_281);
  }
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      local_2aa = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2a8,"GL_EXT_buffer_reference is only supported in Vulkan GLSL.",&local_2a9);
      CompilerError::CompilerError(pCVar4,(string *)local_2a8);
      local_2aa = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      local_2d2 = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2d0,"GL_EXT_buffer_reference requires ESSL 320.",&local_2d1);
      CompilerError::CompilerError(pCVar4,(string *)local_2d0);
      local_2d2 = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1c2)) {
      local_2fa = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2f8,"GL_EXT_buffer_reference requires GLSL 450.",&local_2f9);
      CompilerError::CompilerError(pCVar4,(string *)local_2f8);
      local_2fa = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_320,"GL_EXT_buffer_reference",&local_321);
    require_extension_internal(this,(string *)local_320);
    ::std::__cxx11::string::~string(local_320);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_321);
  }
  else if ((this->super_Compiler).ir.addressing_model != AddressingModelLogical) {
    __range1._6_1_ = 1;
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_348,
               "Only Logical and PhysicalStorageBuffer64EXT addressing models are supported.",
               (allocator *)((long)&__range1 + 7));
    CompilerError::CompilerError(pCVar4,(string *)local_348);
    __range1._6_1_ = 0;
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  __begin1 = (Capability *)&(this->super_Compiler).ir.declared_capabilities;
  __end1 = VectorView<spv::Capability>::begin((VectorView<spv::Capability> *)__begin1);
  cap = VectorView<spv::Capability>::end((VectorView<spv::Capability> *)__begin1);
  do {
    if (__end1 == cap) {
      return;
    }
    local_370 = __end1;
    CVar2 = *__end1;
    if (CVar2 == CapabilityGeometryShaderPassthroughNV) {
      if (local_20->model == ExecutionModelGeometry) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_430,"GL_NV_geometry_shader_passthrough",&local_431);
        require_extension_internal(this,(string *)local_430);
        ::std::__cxx11::string::~string(local_430);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_431);
        local_20->geometry_passthrough = true;
      }
    }
    else if (CVar2 == CapabilityShaderNonUniform) {
      if (((this->options).vulkan_semantics & 1U) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_390,"GL_NV_gpu_shader5",&local_391);
        require_extension_internal(this,(string *)local_390);
        ::std::__cxx11::string::~string(local_390);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_391);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3b8,"GL_EXT_nonuniform_qualifier",&local_3b9);
        require_extension_internal(this,(string *)local_3b8);
        ::std::__cxx11::string::~string(local_3b8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
      }
    }
    else if (CVar2 == CapabilityRuntimeDescriptorArray) {
      if (((this->options).vulkan_semantics & 1U) == 0) {
        local_3e2 = 1;
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3e0,"GL_EXT_nonuniform_qualifier is only supported in Vulkan GLSL.",
                   &local_3e1);
        CompilerError::CompilerError(pCVar4,(string *)local_3e0);
        local_3e2 = 0;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_408,"GL_EXT_nonuniform_qualifier",&local_409);
      require_extension_internal(this,(string *)local_408);
      ::std::__cxx11::string::~string(local_408);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_409);
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void CompilerGLSL::find_static_extensions()
{
	ir.for_each_typed_id<SPIRType>([&](uint32_t, const SPIRType &type) {
		if (type.basetype == SPIRType::Double)
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (!options.es && options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");
		}
		else if (type.basetype == SPIRType::Int64 || type.basetype == SPIRType::UInt64)
		{
			if (options.es)
				SPIRV_CROSS_THROW("64-bit integers not supported in ES profile.");
			if (!options.es)
				require_extension_internal("GL_ARB_gpu_shader_int64");
		}
		else if (type.basetype == SPIRType::Half)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_float16");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_16bit_storage");
		}
		else if (type.basetype == SPIRType::SByte || type.basetype == SPIRType::UByte)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_int8");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_8bit_storage");
		}
		else if (type.basetype == SPIRType::Short || type.basetype == SPIRType::UShort)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_int16");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_16bit_storage");
		}
	});

	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelGLCompute:
		if (!options.es && options.version < 430)
			require_extension_internal("GL_ARB_compute_shader");
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("At least ESSL 3.10 required for compute shaders.");
		break;

	case ExecutionModelGeometry:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_geometry_shader");
		if (!options.es && options.version < 150)
			require_extension_internal("GL_ARB_geometry_shader4");

		if (execution.flags.get(ExecutionModeInvocations) && execution.invocations != 1)
		{
			// Instanced GS is part of 400 core or this extension.
			if (!options.es && options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader5");
		}
		break;

	case ExecutionModelTessellationEvaluation:
	case ExecutionModelTessellationControl:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_tessellation_shader");
		if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_tessellation_shader");
		break;

	case ExecutionModelRayGenerationNV:
	case ExecutionModelIntersectionNV:
	case ExecutionModelAnyHitNV:
	case ExecutionModelClosestHitNV:
	case ExecutionModelMissNV:
	case ExecutionModelCallableNV:
		if (options.es || options.version < 460)
			SPIRV_CROSS_THROW("Ray tracing shaders require non-es profile with version 460 or above.");
		require_extension_internal("GL_NV_ray_tracing");
		break;

	default:
		break;
	}

	if (!pls_inputs.empty() || !pls_outputs.empty())
	{
		if (execution.model != ExecutionModelFragment)
			SPIRV_CROSS_THROW("Can only use GL_EXT_shader_pixel_local_storage in fragment shaders.");
		require_extension_internal("GL_EXT_shader_pixel_local_storage");
	}

	if (!inout_color_attachments.empty())
	{
		if (execution.model != ExecutionModelFragment)
			SPIRV_CROSS_THROW("Can only use GL_EXT_shader_framebuffer_fetch in fragment shaders.");
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot use EXT_shader_framebuffer_fetch in Vulkan GLSL.");
		require_extension_internal("GL_EXT_shader_framebuffer_fetch");
	}

	if (options.separate_shader_objects && !options.es && options.version < 410)
		require_extension_internal("GL_ARB_separate_shader_objects");

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference is only supported in Vulkan GLSL.");
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference requires GLSL 450.");
		require_extension_internal("GL_EXT_buffer_reference");
	}
	else if (ir.addressing_model != AddressingModelLogical)
	{
		SPIRV_CROSS_THROW("Only Logical and PhysicalStorageBuffer64EXT addressing models are supported.");
	}

	// Check for nonuniform qualifier and passthrough.
	// Instead of looping over all decorations to find this, just look at capabilities.
	for (auto &cap : ir.declared_capabilities)
	{
		switch (cap)
		{
		case CapabilityShaderNonUniformEXT:
			if (!options.vulkan_semantics)
				require_extension_internal("GL_NV_gpu_shader5");
			else
				require_extension_internal("GL_EXT_nonuniform_qualifier");
			break;
		case CapabilityRuntimeDescriptorArrayEXT:
			if (!options.vulkan_semantics)
				SPIRV_CROSS_THROW("GL_EXT_nonuniform_qualifier is only supported in Vulkan GLSL.");
			require_extension_internal("GL_EXT_nonuniform_qualifier");
			break;

		case CapabilityGeometryShaderPassthroughNV:
			if (execution.model == ExecutionModelGeometry)
			{
				require_extension_internal("GL_NV_geometry_shader_passthrough");
				execution.geometry_passthrough = true;
			}
			break;

		default:
			break;
		}
	}
}